

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O1

Node * __thiscall anon_unknown.dwarf_42055d::Db::parseQualifiedType(Db *this)

{
  Cache CVar1;
  char *pcVar2;
  char *pcVar3;
  Cache CVar4;
  Cache CVar5;
  Qualifiers QVar6;
  long *plVar7;
  ulong uVar8;
  Node *pNVar9;
  Node *pNVar10;
  ulong uVar11;
  long *plVar12;
  StringView SVar13;
  
  pcVar2 = this->First;
  if ((pcVar2 == this->Last) || (*pcVar2 != 'U')) {
    QVar6 = parseCVQualifiers(this);
    pNVar9 = parseType(this);
    if (pNVar9 != (Node *)0x0) {
      if (QVar6 == QualNone) {
        return pNVar9;
      }
      pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x18);
      CVar4 = pNVar9->RHSComponentCache;
      CVar5 = pNVar9->ArrayCache;
      CVar1 = pNVar9->FunctionCache;
      pNVar10->K = KQualType;
      pNVar10->RHSComponentCache = CVar4;
      pNVar10->ArrayCache = CVar5;
      pNVar10->FunctionCache = CVar1;
      pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eba48;
      *(Qualifiers *)&pNVar10->field_0xc = QVar6;
      pNVar10[1]._vptr_Node = (_func_int **)pNVar9;
      return pNVar10;
    }
  }
  else {
    this->First = pcVar2 + 1;
    SVar13 = parseBareSourceName(this);
    plVar12 = (long *)SVar13.Last;
    plVar7 = (long *)SVar13.First;
    if (plVar7 != plVar12) {
      uVar8 = (long)plVar12 - (long)plVar7;
      if ((uVar8 < 9) || ((char)plVar7[1] != 'o' || *plVar7 != 0x746f7270636a626f)) {
        pNVar9 = parseQualifiedType(this);
        if (pNVar9 != (Node *)0x0) {
          pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar10->K = KVendorExtQualType;
          pNVar10->RHSComponentCache = No;
          pNVar10->ArrayCache = No;
          pNVar10->FunctionCache = No;
          pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb9f0;
          pNVar10[1]._vptr_Node = (_func_int **)pNVar9;
          *(StringView *)&pNVar10[1].K = SVar13;
          return pNVar10;
        }
      }
      else {
        uVar11 = 9;
        if (uVar8 < 9) {
          uVar11 = uVar8;
        }
        pcVar2 = this->First;
        pcVar3 = this->Last;
        this->First = (char *)((long)plVar7 + uVar11);
        this->Last = (char *)plVar12;
        SVar13 = parseBareSourceName(this);
        this->First = pcVar2;
        this->Last = pcVar3;
        if ((SVar13.First != SVar13.Last) &&
           (pNVar9 = parseQualifiedType(this), pNVar9 != (Node *)0x0)) {
          pNVar10 = (Node *)BumpPointerAllocator::allocate(&this->ASTAllocator,0x28);
          pNVar10->K = KObjCProtoName;
          pNVar10->RHSComponentCache = No;
          pNVar10->ArrayCache = No;
          pNVar10->FunctionCache = No;
          pNVar10->_vptr_Node = (_func_int **)&PTR_hasRHSComponentSlow_001eb998;
          pNVar10[1]._vptr_Node = (_func_int **)pNVar9;
          *(StringView *)&pNVar10[1].K = SVar13;
          return pNVar10;
        }
      }
    }
  }
  return (Node *)0x0;
}

Assistant:

Node *Db::parseQualifiedType() {
  if (consumeIf('U')) {
    StringView Qual = parseBareSourceName();
    if (Qual.empty())
      return nullptr;

    // FIXME parse the optional <template-args> here!

    // extension            ::= U <objc-name> <objc-type>  # objc-type<identifier>
    if (Qual.startsWith("objcproto")) {
      StringView ProtoSourceName = Qual.dropFront(std::strlen("objcproto"));
      StringView Proto;
      {
        SwapAndRestore<const char *> SaveFirst(First, ProtoSourceName.begin()),
                                     SaveLast(Last, ProtoSourceName.end());
        Proto = parseBareSourceName();
      }
      if (Proto.empty())
        return nullptr;
      Node *Child = parseQualifiedType();
      if (Child == nullptr)
        return nullptr;
      return make<ObjCProtoName>(Child, Proto);
    }

    Node *Child = parseQualifiedType();
    if (Child == nullptr)
      return nullptr;
    return make<VendorExtQualType>(Child, Qual);
  }

  Qualifiers Quals = parseCVQualifiers();
  Node *Ty = parseType();
  if (Ty == nullptr)
    return nullptr;
  if (Quals != QualNone)
    Ty = make<QualType>(Ty, Quals);
  return Ty;
}